

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * google::protobuf::internal::
       FieldParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                 (uint64_t tag,UnknownFieldLiteParserHelper *field_parser,char *ptr,
                 ParseContext *ctx)

{
  LogMessage *other;
  char *pcVar1;
  uint32_t num;
  LogFinisher local_51;
  uint64_t value;
  
  num = (uint32_t)(tag >> 3);
  if (num == 0) {
    return (char *)0x0;
  }
  switch((uint)tag & 7) {
  case 0:
    pcVar1 = VarintParse<unsigned_long>(ptr,&value);
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
    UnknownFieldLiteParserHelper::AddVarint(field_parser,num,value);
    return pcVar1;
  case 1:
    UnknownFieldLiteParserHelper::AddFixed64(field_parser,num,*(uint64_t *)ptr);
    return ptr + 8;
  case 2:
    pcVar1 = UnknownFieldLiteParserHelper::ParseLengthDelimited(field_parser,num,ptr,ctx);
    break;
  case 3:
    pcVar1 = UnknownFieldLiteParserHelper::ParseGroup(field_parser,num,ptr,ctx);
    break;
  case 4:
    LogMessage::LogMessage
              ((LogMessage *)&value,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
               ,0x339);
    other = LogMessage::operator<<((LogMessage *)&value,"Can\'t happen");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage((LogMessage *)&value);
    return ptr;
  case 5:
    UnknownFieldLiteParserHelper::AddFixed32(field_parser,num,*(uint32_t *)ptr);
    return ptr + 4;
  default:
    goto LAB_0033a7a8;
  }
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
LAB_0033a7a8:
  return (char *)0x0;
}

Assistant:

PROTOBUF_NODISCARD const char* FieldParser(uint64_t tag, T& field_parser,
                                           const char* ptr, ParseContext* ctx) {
  uint32_t number = tag >> 3;
  GOOGLE_PROTOBUF_PARSER_ASSERT(number != 0);
  using WireType = internal::WireFormatLite::WireType;
  switch (tag & 7) {
    case WireType::WIRETYPE_VARINT: {
      uint64_t value;
      ptr = VarintParse(ptr, &value);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      field_parser.AddVarint(number, value);
      break;
    }
    case WireType::WIRETYPE_FIXED64: {
      uint64_t value = UnalignedLoad<uint64_t>(ptr);
      ptr += 8;
      field_parser.AddFixed64(number, value);
      break;
    }
    case WireType::WIRETYPE_LENGTH_DELIMITED: {
      ptr = field_parser.ParseLengthDelimited(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_START_GROUP: {
      ptr = field_parser.ParseGroup(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_END_GROUP: {
      GOOGLE_LOG(FATAL) << "Can't happen";
      break;
    }
    case WireType::WIRETYPE_FIXED32: {
      uint32_t value = UnalignedLoad<uint32_t>(ptr);
      ptr += 4;
      field_parser.AddFixed32(number, value);
      break;
    }
    default:
      return nullptr;
  }
  return ptr;
}